

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_RBIT(DisasContext_conflict1 *s,arg_rr *a)

{
  ulong uVar1;
  
  uVar1 = s->features;
  if ((uVar1 & 0x40) != 0) {
    op_rr(s,a,gen_helper_rbit);
  }
  return SUB41(((uint)uVar1 & 0x40) >> 6,0);
}

Assistant:

static bool trans_RBIT(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    return op_rr(s, a, gen_helper_rbit);
}